

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Sintatico::comando_sem_rotulo(Sintatico *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  switch(this->tok) {
  case 0x1f:
    condicional(this);
    return;
  case 0x20:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
    goto switchD_00102af2_caseD_20;
  case 0x21:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"then",&local_49);
    error(this,&local_28);
  case 0x2a:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"while",&local_49);
    error(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    _Unwind_Resume(extraout_RAX);
  case 0x22:
    composto(this);
    return;
  case 0x29:
    repetitivo(this);
    return;
  default:
    if (this->tok == 2) {
      identificador(this);
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,0x1b);
      if (!bVar1) {
        chamada_de_procedimento(this);
        return;
      }
      atribuicao(this);
      return;
    }
switchD_00102af2_caseD_20:
    saltBlank(this);
    return;
  }
}

Assistant:

void Sintatico::comando_sem_rotulo() {
  switch (tok) {
    case BEGIN: composto(); break;
    case IF   : condicional(); break;
    case ELSE : error("then");
    case WHILE: repetitivo(); break;
    case DO : error("while");
    case LETRA:
      identificador();
      if (isEqual(tok, DOISPONTOSIGUAL))
        atribuicao();
      else chamada_de_procedimento();
      break;
    default: saltBlank();
  }
}